

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool __thiscall re2::Regexp::ComputeSimple(Regexp *this)

{
  bool bVar1;
  Regexp **ppRVar2;
  LogMessage *this_00;
  ostream *poVar3;
  Regexp *in_RDI;
  int i;
  Regexp **subs;
  byte local_1c2;
  byte local_1c1;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  LogMessage *in_stack_fffffffffffffe60;
  int local_1c;
  bool local_1;
  
  switch(in_RDI->op_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    local_1 = true;
    break;
  case '\x05':
  case '\x06':
    ppRVar2 = sub(in_RDI);
    for (local_1c = 0; local_1c < (int)(uint)in_RDI->nsub_; local_1c = local_1c + 1) {
      bVar1 = simple(ppRVar2[local_1c]);
      if (!bVar1) {
        return false;
      }
    }
    local_1 = true;
    break;
  case '\a':
  case '\b':
  case '\t':
    ppRVar2 = sub(in_RDI);
    bVar1 = simple(*ppRVar2);
    if (bVar1) {
      if (((*ppRVar2)->op_ - 1 < 2) || ((*ppRVar2)->op_ - 7 < 3)) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
    break;
  case '\n':
    local_1 = false;
    break;
  case '\v':
    ppRVar2 = sub(in_RDI);
    local_1 = simple(*ppRVar2);
    break;
  case '\x14':
    if ((in_RDI->field_7).field_1.name_ == (string *)0x0) {
      bVar1 = CharClass::empty((in_RDI->field_7).field_3.cc_);
      local_1c2 = 0;
      if (!bVar1) {
        bVar1 = CharClass::full((in_RDI->field_7).field_3.cc_);
        local_1c2 = bVar1 ^ 0xff;
      }
      local_1 = (bool)(local_1c2 & 1);
    }
    else {
      bVar1 = CharClassBuilder::empty((in_RDI->field_7).field_3.ccb_);
      local_1c1 = 0;
      if (!bVar1) {
        bVar1 = CharClassBuilder::full((in_RDI->field_7).field_3.ccb_);
        local_1c1 = bVar1 ^ 0xff;
      }
      local_1 = (bool)(local_1c1 & 1);
    }
    break;
  default:
    LogMessage::LogMessage
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
    this_00 = (LogMessage *)LogMessage::stream((LogMessage *)&stack0xfffffffffffffe60);
    poVar3 = std::operator<<((ostream *)this_00,"Case not handled in ComputeSimple: ");
    std::operator<<(poVar3,in_RDI->op_);
    LogMessage::~LogMessage(this_00);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Regexp::ComputeSimple() {
  Regexp** subs;
  switch (op_) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      return true;
    case kRegexpConcat:
    case kRegexpAlternate:
      // These are simple as long as the subpieces are simple.
      subs = sub();
      for (int i = 0; i < nsub_; i++)
        if (!subs[i]->simple())
          return false;
      return true;
    case kRegexpCharClass:
      // Simple as long as the char class is not empty, not full.
      if (ccb_ != NULL)
        return !ccb_->empty() && !ccb_->full();
      return !cc_->empty() && !cc_->full();
    case kRegexpCapture:
      subs = sub();
      return subs[0]->simple();
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      subs = sub();
      if (!subs[0]->simple())
        return false;
      switch (subs[0]->op_) {
        case kRegexpStar:
        case kRegexpPlus:
        case kRegexpQuest:
        case kRegexpEmptyMatch:
        case kRegexpNoMatch:
          return false;
        default:
          break;
      }
      return true;
    case kRegexpRepeat:
      return false;
  }
  LOG(DFATAL) << "Case not handled in ComputeSimple: " << op_;
  return false;
}